

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O3

int is_door_locked(tgestate_t *state)

{
  byte bVar1;
  long lVar2;
  
  lVar2 = 0x775;
  while (bVar1 = *(byte *)((long)state->jmpbuf_main[0].__jmpbuf + lVar2 + -0x20),
        ((bVar1 ^ state->current_door) & 0x7f) != 0) {
    lVar2 = lVar2 + 1;
  }
  if (-1 < (char)bVar1) {
    return 0;
  }
  queue_message(state,message_THE_DOOR_IS_LOCKED);
  return 1;
}

Assistant:

int is_door_locked(tgestate_t *state)
{
  doorindex_t  cur;   /* was C */
  doorindex_t *door;  /* was HL */
  uint8_t      iters; /* was B */

  assert(state != NULL);

  cur   = state->current_door & ~door_REVERSE;
  door  = &state->locked_doors[0];
  iters = NELEMS(state->locked_doors);
  do
  {
    if ((*door & ~door_LOCKED) == cur)
    {
      if ((*door & door_LOCKED) == 0)
        return 0; /* Door is open. */

      queue_message(state, message_THE_DOOR_IS_LOCKED);
      return 1; /* Door is locked. */
    }
    door++;
  }
  while (--iters);

  return 0; /* Door is open. */
}